

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O0

void __thiscall
MacProj::mac_sync_compute
          (MacProj *this,int level,Array<MultiFab_*,_3> *Ucorr,MultiFab *u_mac,MultiFab *Vsync,
          MultiFab *Ssync,FluxRegister *adv_flux_reg,
          Vector<AdvectionForm,_std::allocator<AdvectionForm>_> *advectionType,Real prev_time,
          Real dt,int num_state_comps,Real be_cn_theta,int do_mom_diff,bool update_fluxreg)

{
  AdvectionForm AVar1;
  byte bVar2;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> _Var3;
  pointer pbVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  AmrLevel **ppAVar7;
  __uniq_ptr_data<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>,_true,_true>
  _Var8;
  long lVar9;
  NavierStokesBase *pNVar10;
  FArrayBox *pFVar11;
  FArrayBox *pFVar12;
  BCRec *pBVar13;
  AdvectionForm *pAVar14;
  uint *puVar15;
  iterator piVar16;
  reference ppMVar17;
  MultiFab *in_RCX;
  _func_int **in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  element_type *in_R8;
  __uniq_ptr_data<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>,_true,_true>
  in_R9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_XMM0_Qa;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_XMM2_Qa;
  int in_stack_00000018;
  int in_stack_00000020;
  byte in_stack_00000028;
  int comp_3;
  int d_1;
  Real mlt;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> math_bcs_1;
  bool godunov_use_ppm;
  int icomp;
  Vector<int,_std::allocator<int>_> iconserv_h;
  DeviceVector<int> iconserv;
  MultiFab *Q;
  BCRec *d_bcrec_ptr_1;
  bool is_velocity_1;
  MultiFab *sync_ptr_1;
  int sync_comp_1;
  int comp_2;
  Array4<const_double> *rho_1;
  Array4<const_double> *visc_1;
  Array4<const_double> *rho;
  Array4<const_double> *gp;
  Array4<const_double> *visc;
  Array4<double> *tf;
  int comp_1;
  Box gbx;
  MFIter Smfi;
  MultiFab forcing_term;
  int d;
  MultiFab momenta;
  MultiFab *rhoMF;
  FillPatchIterator rho_fpi;
  MultiFab *Gp;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> divu_fp;
  BCRec *d_bcrec_ptr;
  bool is_velocity;
  MultiFab *sync_ptr;
  int sync_comp;
  int comp;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> math_bcs;
  MultiFab *Smf;
  FillPatchIterator S_fpi;
  MultiFab visc_terms;
  BoxArray *ba;
  int i;
  int nghost;
  int ncomp;
  MultiFab *area;
  NavierStokesBase *ns_level;
  Geometry *geom;
  DistributionMapping *dmap;
  BoxArray *grids;
  FabFactory<amrex::FArrayBox> *in_stack_ffffffffffffd8f8;
  NavierStokesBase *pNVar18;
  Amr *in_stack_ffffffffffffd900;
  Amr *pAVar19;
  MFIter *in_stack_ffffffffffffd908;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffd910;
  undefined8 in_stack_ffffffffffffd918;
  MFInfo *in_stack_ffffffffffffd920;
  FabArrayBase *in_stack_ffffffffffffd928;
  MFIter *in_stack_ffffffffffffd930;
  int in_stack_ffffffffffffd938;
  int in_stack_ffffffffffffd93c;
  undefined4 in_stack_ffffffffffffd940;
  undefined4 in_stack_ffffffffffffd944;
  anon_class_256_4_43309bcd *in_stack_ffffffffffffd948;
  Box *in_stack_ffffffffffffd950;
  undefined4 in_stack_ffffffffffffd960;
  undefined4 in_stack_ffffffffffffd964;
  undefined8 in_stack_ffffffffffffd968;
  MFIter *in_stack_ffffffffffffd970;
  NavierStokesBase *in_stack_ffffffffffffd978;
  NavierStokesBase *in_stack_ffffffffffffd980;
  int iVar20;
  NavierStokesBase *in_stack_ffffffffffffd988;
  NavierStokesBase *in_stack_ffffffffffffd990;
  PODVector<int,_std::allocator<int>_> *in_stack_ffffffffffffd998;
  undefined4 uVar21;
  uint in_stack_ffffffffffffd9a0;
  undefined4 in_stack_ffffffffffffd9a4;
  string *in_stack_ffffffffffffd9a8;
  undefined4 uVar22;
  FluxRegister *in_stack_ffffffffffffd9b0;
  int in_stack_ffffffffffffd9c0;
  MFInfo *local_2610;
  MFInfo *local_25f8;
  FabArrayBase *local_23a0;
  NavierStokesBase *local_2398;
  _Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> local_2390;
  int local_2384;
  BCRec *local_2170;
  FabArray<amrex::FArrayBox> *local_2168;
  int local_215c;
  MFInfo *local_20b0;
  MFInfo *local_2090;
  int local_2088;
  int local_2084;
  string local_2078 [95];
  byte local_2019;
  int *local_2018;
  int *local_2010;
  int local_2000;
  undefined4 local_1ffc;
  PODVector<int,_std::allocator<int>_> local_1fe0;
  FabArrayBase *local_1fc8;
  NavierStokesBase *local_1fc0;
  byte local_1fb1;
  FabArray<amrex::FArrayBox> *local_1fb0;
  int local_1fa8;
  int local_1fa4;
  undefined1 local_1fa0 [64];
  undefined1 auStack_1f60 [62];
  undefined1 in_stack_ffffffffffffe0de;
  undefined1 in_stack_ffffffffffffe0df;
  MultiFab *in_stack_ffffffffffffe0e0;
  int in_stack_ffffffffffffe0ec;
  MultiFab *in_stack_ffffffffffffe0f0;
  BATType in_stack_ffffffffffffe0f8;
  undefined4 in_stack_ffffffffffffe0fc;
  undefined8 in_stack_ffffffffffffe100;
  undefined1 local_1ee0 [64];
  undefined1 auStack_1ea0 [64];
  undefined1 local_1e60 [64];
  undefined1 auStack_1e20 [64];
  undefined1 auStack_1de0 [64];
  Array4<const_double> local_1da0;
  Array4<const_double> *local_1d60;
  Array4<const_double> local_1d58;
  Array4<const_double> *local_1d18;
  undefined1 local_1d10 [64];
  undefined1 auStack_1cd0 [64];
  undefined1 auStack_1c90 [47];
  undefined1 in_stack_ffffffffffffe39f;
  undefined8 in_stack_ffffffffffffe3a0;
  undefined1 in_stack_ffffffffffffe3af;
  undefined5 in_stack_ffffffffffffe3b0;
  undefined1 in_stack_ffffffffffffe3b5;
  undefined1 in_stack_ffffffffffffe3b6;
  undefined1 in_stack_ffffffffffffe3b7;
  undefined4 in_stack_ffffffffffffe3b8;
  undefined4 in_stack_ffffffffffffe3bc;
  undefined7 in_stack_ffffffffffffe3c0;
  undefined1 in_stack_ffffffffffffe3c7;
  int in_stack_ffffffffffffe3c8;
  int in_stack_ffffffffffffe3cc;
  undefined4 in_stack_ffffffffffffe3d0;
  int in_stack_ffffffffffffe3d4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffe3d8;
  int in_stack_ffffffffffffe3e0;
  int in_stack_ffffffffffffe3e4;
  MultiFab *in_stack_ffffffffffffe3e8;
  undefined8 in_stack_ffffffffffffe3f0;
  undefined8 in_stack_ffffffffffffe3f8;
  undefined8 in_stack_ffffffffffffe400;
  undefined8 in_stack_ffffffffffffe408;
  undefined8 in_stack_ffffffffffffe410;
  undefined8 in_stack_ffffffffffffe418;
  undefined8 in_stack_ffffffffffffe420;
  undefined8 in_stack_ffffffffffffe428;
  int in_stack_ffffffffffffe430;
  element_type *in_stack_ffffffffffffe440;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffe448;
  element_type *in_stack_ffffffffffffe450;
  int in_stack_ffffffffffffe458;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_ffffffffffffe460;
  BCRec *in_stack_ffffffffffffe468;
  Geometry *in_stack_ffffffffffffe470;
  Array4<const_double> local_1b50;
  Array4<const_double> *local_1b10;
  Array4<const_double> local_1b08;
  Array4<const_double> *local_1ac8;
  MultiFab *in_stack_ffffffffffffe570;
  MultiFab *in_stack_ffffffffffffe578;
  Array4<const_double> *in_stack_ffffffffffffe580;
  MultiFab *in_stack_ffffffffffffe588;
  MultiFab *in_stack_ffffffffffffe590;
  undefined8 in_stack_ffffffffffffe598;
  undefined8 in_stack_ffffffffffffe5a0;
  undefined8 in_stack_ffffffffffffe5a8;
  undefined4 in_stack_ffffffffffffe5b0;
  undefined4 in_stack_ffffffffffffe5b4;
  undefined8 in_stack_ffffffffffffe5b8;
  undefined4 in_stack_ffffffffffffe5c0;
  undefined4 in_stack_ffffffffffffe5c4;
  undefined8 in_stack_ffffffffffffe5c8;
  undefined4 in_stack_ffffffffffffe5d0;
  undefined4 uVar23;
  undefined4 in_stack_ffffffffffffe5d4;
  int in_stack_ffffffffffffe5d8;
  undefined4 in_stack_ffffffffffffe5dc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffe5e0;
  int in_stack_ffffffffffffe5e8;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> in_stack_ffffffffffffe5f0;
  int in_stack_ffffffffffffe5f8;
  undefined4 in_stack_ffffffffffffe5fc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffe600;
  DeviceVector<int> *in_stack_ffffffffffffe608;
  Geometry *in_stack_ffffffffffffe610;
  DeviceVector<int> *in_stack_ffffffffffffe618;
  _func_int **local_19b0;
  RefID local_19a8;
  RefID RStack_19a0;
  Real local_1998;
  Real RStack_1990;
  __uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  local_1988;
  undefined4 local_17fc;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  element_type *peStack_17e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_17d8;
  FabArrayBase local_17d0;
  undefined8 local_1650;
  FillPatchIterator local_1648;
  MultiFab *local_1438;
  undefined1 local_1428 [656];
  _Bit_type *local_1198;
  undefined8 uStack_1190;
  _Bit_pointer local_1188;
  int aiStack_1180 [6];
  undefined1 local_1168 [384];
  RefID local_fe8;
  _func_int **pp_Stack_fe0;
  pointer local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 local_fa8 [3];
  RefID RStack_f90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f88;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> local_f78;
  int local_f6c;
  MFInfo local_f68 [9];
  FabArrayBase local_de8;
  MFIter local_c68 [4];
  MFInfo local_ae8;
  undefined1 in_stack_fffffffffffff557;
  _Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false> in_stack_fffffffffffff558;
  undefined1 in_stack_fffffffffffff567;
  undefined8 in_stack_fffffffffffff568;
  undefined4 in_stack_fffffffffffff574;
  undefined8 in_stack_fffffffffffff578;
  undefined4 in_stack_fffffffffffff580;
  undefined4 in_stack_fffffffffffff584;
  undefined8 in_stack_fffffffffffff588;
  MFInfo local_668;
  undefined8 local_640;
  byte local_631;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_630;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_620;
  _Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> local_618;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_610;
  MultiFab *local_608;
  BATType in_stack_fffffffffffffa08;
  undefined8 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa24;
  undefined8 in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  undefined8 in_stack_fffffffffffffa38;
  Array4<const_double> local_590;
  uint local_54c;
  pointer local_548;
  Array4<const_double> local_540;
  undefined1 local_4fc [68];
  uint local_4b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4b0;
  uint local_4a8;
  int local_4a4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a0;
  __uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_498;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_490;
  uint local_488;
  Box *local_480;
  BATType local_478;
  BATOp BStack_474;
  RefID local_430;
  int local_428;
  int iStack_424;
  int in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  MultiFab *in_stack_fffffffffffffc08;
  MultiFab *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  uint in_stack_fffffffffffffc20;
  Dim3 local_3dc;
  pointer in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  pointer in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc48;
  RefID in_stack_fffffffffffffc50;
  RefID in_stack_fffffffffffffc58;
  _Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false> in_stack_fffffffffffffc60;
  _Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> in_stack_fffffffffffffc70;
  FluxRegister *local_2f0;
  uint local_2e8;
  Ref *local_2e0;
  uint local_2d8;
  Ref *local_2d0 [9];
  element_type *local_288;
  undefined4 local_27c;
  element_type *local_278;
  undefined4 local_26c;
  Box *local_268;
  MultiArray4<double> local_260;
  uint local_258;
  pointer local_250;
  int local_248;
  int iStack_244;
  uint local_240;
  undefined4 local_23c;
  IntVect *local_238;
  undefined4 local_22c;
  IntVect *local_228;
  undefined4 local_21c;
  unique_ptr<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_218;
  __uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  local_210;
  uint local_208;
  Dim3 local_1fc [2];
  Dim3 local_1e0 [2];
  undefined8 local_1c8;
  undefined8 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  int in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  element_type *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  element_type *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe80;
  _Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  element_type *in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined1 *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  RefID in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  Geometry *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  DataAllocator in_stack_fffffffffffffef0;
  pointer local_f0;
  int local_e8;
  int local_e4;
  MultiArray4<double> local_e0;
  MultiArray4<const_double> local_d8;
  pointer local_d0;
  int local_c8;
  pointer local_c0;
  int local_b8;
  int iStack_b4;
  int local_b0;
  undefined4 local_ac;
  Box *local_a8;
  undefined4 local_9c;
  unique_ptr<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_98;
  undefined4 local_8c;
  Box *local_88;
  string *local_80;
  int local_78;
  Box *local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined8 local_58;
  undefined4 local_4c;
  undefined8 local_48;
  undefined4 local_3c;
  undefined8 local_38;
  
  local_631 = in_stack_00000028 & 1;
  local_630._M_pi = in_XMM2_Qa;
  local_620._M_pi = in_XMM0_Qa;
  local_618._M_head_impl =
       (FabArray<amrex::FArrayBox> *)
       in_R9.
       super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
       .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl;
  local_610._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_R8;
  local_608 = in_RCX;
  ppAVar7 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                      ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                       in_stack_ffffffffffffd900,(size_type)in_stack_ffffffffffffd8f8);
  local_640 = amrex::AmrLevel::boxArray(*ppAVar7);
  ppAVar7 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                      ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                       in_stack_ffffffffffffd900,(size_type)in_stack_ffffffffffffd8f8);
  local_668.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)amrex::AmrLevel::DistributionMap(*ppAVar7);
  local_668.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)amrex::AmrMesh::Geom
                          ((AmrMesh *)in_stack_ffffffffffffd900,
                           (int)((ulong)in_stack_ffffffffffffd8f8 >> 0x20));
  local_668.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)amrex::Amr::getLevel
                          (in_stack_ffffffffffffd900,(int)((ulong)in_stack_ffffffffffffd8f8 >> 0x20)
                          );
  local_668.arena =
       (Arena *)NavierStokesBase::Area
                          ((NavierStokesBase *)
                           local_668.tags.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  local_668._4_4_ = 1;
  local_668._0_4_ = 0;
  local_2090 = &local_ae8;
  do {
    amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffd900);
    local_2090 = (MFInfo *)
                 ((long)&local_2090[9].tags.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data + 8);
  } while (local_2090 != &local_668);
  local_20b0 = local_f68;
  do {
    amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffd900);
    local_20b0 = (MFInfo *)
                 &local_20b0[9].tags.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
  } while (local_20b0 != &local_ae8);
  for (local_f6c = 0; local_f6c < 3; local_f6c = local_f6c + 1) {
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
               in_stack_ffffffffffffd900,(size_type)in_stack_ffffffffffffd8f8);
    _Var8.
    super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
         (__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          )amrex::AmrLevel::getEdgeBoxArray
                     ((AmrLevel *)in_stack_ffffffffffffd900,
                      (int)((ulong)in_stack_ffffffffffffd8f8 >> 0x20));
    pbVar4 = local_668.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar9 = (long)local_f6c;
    local_fa8[2] = (BARef *)0x0;
    RStack_f90.data = (Ref *)0x0;
    local_fa8[0]._0_4_ = 0;
    local_fa8[0]._4_4_ = 0;
    local_fa8[1]._0_4_ = 0;
    local_fa8[1]._4_4_ = 0;
    local_f88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_f78._M_head_impl =
         (FabFactory<amrex::FArrayBox> *)
         _Var8.
         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
    amrex::MFInfo::MFInfo((MFInfo *)0x84a5fb);
    amrex::AmrLevel::Factory((AmrLevel *)in_stack_ffffffffffffd900);
    (**(code **)(*(long *)((long)&local_ae8 + lVar9 * 0x180) + 0x10))
              ((long)&local_ae8 + lVar9 * 0x180,
               _Var8.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl,
               pbVar4,in_stack_00000018,0,local_fa8);
    amrex::MFInfo::~MFInfo((MFInfo *)0x84a660);
    pbVar4 = local_668.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    _Var3._M_head_impl = local_f78._M_head_impl;
    lVar9 = (long)local_f6c;
    local_fd8 = (pointer)0x0;
    uStack_fd0 = (_Bit_type *)0x0;
    local_fe8.data = (Ref *)0x0;
    pp_Stack_fe0 = (_func_int **)0x0;
    local_fc8 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x84a6dc);
    in_stack_ffffffffffffd8f8 = amrex::AmrLevel::Factory((AmrLevel *)in_stack_ffffffffffffd900);
    (**(code **)(*(long *)((long)local_f68 + lVar9 * 0x180) + 0x10))
              ((long)local_f68 + lVar9 * 0x180,_Var3._M_head_impl,pbVar4,1,0,&local_fe8);
    amrex::MFInfo::~MFInfo((MFInfo *)0x84a73f);
  }
  NavierStokesBase::nghost_force((NavierStokesBase *)0x84a7dc);
  local_1188 = (_Bit_pointer)0x0;
  aiStack_1180[0] = 0;
  aiStack_1180[1] = 0;
  local_1198 = (_Bit_type *)0x0;
  uStack_1190._0_4_ = 0;
  uStack_1190._4_4_ = 0;
  aiStack_1180[2] = 0;
  aiStack_1180[3] = 0;
  amrex::MFInfo::MFInfo((MFInfo *)0x84a819);
  pNVar10 = (NavierStokesBase *)amrex::AmrLevel::Factory((AmrLevel *)in_stack_ffffffffffffd900);
  amrex::MultiFab::MultiFab
            ((MultiFab *)CONCAT44(in_stack_ffffffffffffd944,in_stack_ffffffffffffd940),
             (BoxArray *)CONCAT44(in_stack_ffffffffffffd93c,in_stack_ffffffffffffd938),
             (DistributionMapping *)in_stack_ffffffffffffd930,
             (int)((ulong)in_stack_ffffffffffffd928 >> 0x20),(int)in_stack_ffffffffffffd928,
             in_stack_ffffffffffffd920,(FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffd950);
  amrex::MFInfo::~MFInfo((MFInfo *)0x84a872);
  NavierStokesBase::nghost_state(pNVar10);
  pNVar10 = (NavierStokesBase *)CONCAT44((int)((ulong)pNVar10 >> 0x20),in_stack_00000018);
  amrex::FillPatchIterator::FillPatchIterator
            ((FillPatchIterator *)CONCAT44(in_stack_ffffffffffffd944,in_stack_ffffffffffffd940),
             (AmrLevel *)CONCAT44(in_stack_ffffffffffffd93c,in_stack_ffffffffffffd938),
             (MultiFab *)in_stack_ffffffffffffd930,(int)((ulong)in_stack_ffffffffffffd928 >> 0x20),
             (Real)in_stack_ffffffffffffd920,(int)((ulong)in_stack_ffffffffffffd918 >> 0x20),
             (int)in_stack_ffffffffffffd918,(int)in_stack_ffffffffffffd950);
  local_1428._120_8_ = amrex::FillPatchIterator::get_mf((FillPatchIterator *)(local_1428 + 0x80));
  bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffd900,(char *)pNVar10);
  if (bVar6) {
    std::allocator<amrex::BCRec>::allocator((allocator<amrex::BCRec> *)0x84a927);
    amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
              ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_ffffffffffffd900,
               (size_type)pNVar10,(allocator_type *)0x84a941);
    std::allocator<amrex::BCRec>::~allocator((allocator<amrex::BCRec> *)0x84a950);
    for (local_1428._88_4_ = 0; (int)local_1428._88_4_ < in_stack_00000018;
        local_1428._88_4_ = local_1428._88_4_ + 1) {
      NavierStokesBase::fetchBCArray
                (in_stack_ffffffffffffd990,(int)((ulong)in_stack_ffffffffffffd988 >> 0x20),
                 (int)in_stack_ffffffffffffd988,(int)((ulong)in_stack_ffffffffffffd980 >> 0x20));
      uVar23 = (undefined4)((ulong)in_stack_ffffffffffffd980 >> 0x20);
      amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator=
                ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_ffffffffffffd900,
                 (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)pNVar10);
      amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
                ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x84a9b7);
      if ((int)local_1428._88_4_ < 3) {
        local_215c = local_1428._88_4_;
      }
      else {
        local_215c = local_1428._88_4_ + -3;
      }
      local_1428._60_4_ = local_215c;
      if ((int)local_1428._88_4_ < 3) {
        local_2168 = (FabArray<amrex::FArrayBox> *)local_610._M_pi;
      }
      else {
        local_2168 = local_618._M_head_impl;
      }
      local_1428._48_8_ = local_2168;
      local_1428[0x2f] = -((int)local_1428._88_4_ < 3) & 1;
      if ((int)local_1428._88_4_ < 3) {
        local_2170 = NavierStokesBase::get_bcrec_velocity_d_ptr((NavierStokesBase *)0x84aa5b);
        pNVar18 = pNVar10;
        pAVar19 = in_stack_ffffffffffffd900;
      }
      else {
        local_2170 = NavierStokesBase::get_bcrec_scalars_d_ptr((NavierStokesBase *)0x84aa72);
        pNVar18 = pNVar10;
        pAVar19 = in_stack_ffffffffffffd900;
      }
      local_1428._32_8_ = local_2170;
      NavierStokesBase::EBFactory((NavierStokesBase *)0x84aa97);
      bVar6 = amrex::EBFArrayBoxFactory::isAllRegular((EBFArrayBoxFactory *)0x84aa9f);
      if (bVar6) {
        pNVar10 = (NavierStokesBase *)(local_608 + 1);
        in_stack_ffffffffffffd900 = (Amr *)(local_608 + 2);
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)pAVar19,(size_type)pNVar18);
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)pAVar19,(size_type)pNVar18);
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)pAVar19,(size_type)pNVar18);
        in_stack_ffffffffffffd970 =
             (MFIter *)(local_1428._32_8_ + (long)(int)local_1428._60_4_ * 0x18);
        in_stack_ffffffffffffd980 =
             (NavierStokesBase *)(CONCAT44(uVar23,(uint)local_1428[0x2f]) & 0xffffffff00000001);
        in_stack_ffffffffffffd978 =
             (NavierStokesBase *)
             local_668.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        MOL::ComputeSyncAofs
                  ((MultiFab *)in_stack_ffffffffffffe100,in_stack_ffffffffffffe0fc,
                   in_stack_ffffffffffffe0f8,in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0ec,
                   in_stack_ffffffffffffe0e0,(MultiFab *)in_stack_ffffffffffffe3f0,
                   (MultiFab *)in_stack_ffffffffffffe3f8,(MultiFab *)in_stack_ffffffffffffe400,
                   (MultiFab *)in_stack_ffffffffffffe408,(MultiFab *)in_stack_ffffffffffffe410,
                   (MultiFab *)in_stack_ffffffffffffe418,(MultiFab *)in_stack_ffffffffffffe420,
                   (MultiFab *)in_stack_ffffffffffffe428,in_stack_ffffffffffffe430,
                   (bool)in_stack_ffffffffffffe0df,(MultiFab *)in_stack_ffffffffffffe440,
                   (MultiFab *)in_stack_ffffffffffffe448._M_pi,(MultiFab *)in_stack_ffffffffffffe450
                   ,in_stack_ffffffffffffe458,in_stack_ffffffffffffe460,in_stack_ffffffffffffe468,
                   in_stack_ffffffffffffe470,(bool)in_stack_ffffffffffffe0de);
      }
      else {
        pNVar10 = (NavierStokesBase *)(local_608 + 1);
        in_stack_ffffffffffffd900 = (Amr *)(local_608 + 2);
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)pAVar19,(size_type)pNVar18);
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)pAVar19,(size_type)pNVar18);
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)pAVar19,(size_type)pNVar18);
        in_stack_ffffffffffffd978 =
             (NavierStokesBase *)
             local_668.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        bVar2 = local_1428[0x2f];
        in_stack_ffffffffffffd970 =
             (MFIter *)(local_1428._32_8_ + (long)(int)local_1428._60_4_ * 0x18);
        std::__cxx11::string::string
                  ((string *)local_1428,(string *)&NavierStokesBase::redistribution_type_abi_cxx11_)
        ;
        in_stack_ffffffffffffd988 = (NavierStokesBase *)local_1428;
        in_stack_ffffffffffffd980 =
             (NavierStokesBase *)(CONCAT44(uVar23,(uint)bVar2) & 0xffffffff00000001);
        EBMOL::ComputeSyncAofs
                  ((MultiFab *)in_stack_fffffffffffff588,in_stack_fffffffffffff584,
                   in_stack_fffffffffffff580,(MultiFab *)in_stack_fffffffffffff578,
                   in_stack_fffffffffffff574,(MultiFab *)in_stack_fffffffffffff568,
                   (MultiFab *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                   (MultiFab *)in_stack_fffffffffffffbe8._M_head_impl,
                   (MultiFab *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (MultiFab *)in_stack_fffffffffffffbf8._M_pi,
                   (MultiFab *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                   in_stack_fffffffffffffc08,in_stack_fffffffffffffc10,
                   (MultiFab *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                   in_stack_fffffffffffffc20,(bool)in_stack_fffffffffffff567,
                   (MultiFab *)in_stack_fffffffffffffc30,
                   (MultiFab *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                   (MultiFab *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc48,
                   (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                   in_stack_fffffffffffffc50.data,(BCRec *)in_stack_fffffffffffffc58.data,
                   (Geometry *)in_stack_fffffffffffffc60._M_head_impl,
                   (Real)in_stack_fffffffffffff558._M_head_impl,(bool)in_stack_fffffffffffff557,
                   (string *)in_stack_fffffffffffffc70._M_head_impl);
        std::__cxx11::string::~string((string *)local_1428);
      }
    }
    amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
              ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x84b068);
  }
  else {
    bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffd900,(char *)pNVar10);
    if (((bVar6) ||
        (bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffd900,(char *)pNVar10), bVar6)) ||
       (bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffd900,(char *)pNVar10), bVar6)) {
      NavierStokesBase::nghost_force((NavierStokesBase *)0x84b112);
      NavierStokesBase::getDivCond
                (in_stack_ffffffffffffd980,(int)((ulong)in_stack_ffffffffffffd978 >> 0x20),
                 (Real)in_stack_ffffffffffffd970);
      std::unique_ptr<amrex::MultiFab,std::default_delete<amrex::MultiFab>>::
      unique_ptr<std::default_delete<amrex::MultiFab>,void>
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_ffffffffffffd900,(pointer)pNVar10);
      local_1438 = amrex::AmrLevel::get_old_data
                             ((AmrLevel *)in_stack_ffffffffffffd900,(int)((ulong)pNVar10 >> 0x20));
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd900,(value_type)pNVar10);
      if (((double)local_630._M_pi != 1.0) || (NAN((double)local_630._M_pi))) {
        (**(code **)(*(long *)local_668.tags.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0x198))
                  (local_620._M_pi,
                   local_668.tags.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,local_1168,0,in_stack_00000018);
      }
      NavierStokesBase::nghost_state(pNVar10);
      amrex::FillPatchIterator::FillPatchIterator
                ((FillPatchIterator *)CONCAT44(in_stack_ffffffffffffd944,in_stack_ffffffffffffd940),
                 (AmrLevel *)CONCAT44(in_stack_ffffffffffffd93c,in_stack_ffffffffffffd938),
                 (MultiFab *)in_stack_ffffffffffffd930,
                 (int)((ulong)in_stack_ffffffffffffd928 >> 0x20),(Real)in_stack_ffffffffffffd920,
                 (int)((ulong)in_stack_ffffffffffffd918 >> 0x20),(int)in_stack_ffffffffffffd918,
                 (int)in_stack_ffffffffffffd950);
      local_1650 = amrex::FillPatchIterator::get_mf(&local_1648);
      amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffd900);
      if (in_stack_00000020 == 1) {
        amrex::FabArrayBase::nGrow((FabArrayBase *)local_1428._120_8_,0);
        local_17e8 = 0;
        peStack_17e0 = (element_type *)0x0;
        local_17f8 = 0;
        uStack_17f0 = 0;
        local_17d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        amrex::MFInfo::MFInfo((MFInfo *)0x84b2e2);
        amrex::FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x84b2ef);
        amrex::MultiFab::define
                  ((MultiFab *)in_stack_ffffffffffffd950,(BoxArray *)in_stack_ffffffffffffd948,
                   (DistributionMapping *)
                   CONCAT44(in_stack_ffffffffffffd944,in_stack_ffffffffffffd940),
                   in_stack_ffffffffffffd93c,in_stack_ffffffffffffd938,
                   (MFInfo *)in_stack_ffffffffffffd930,
                   (FabFactory<amrex::FArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffd964,in_stack_ffffffffffffd960));
        amrex::MFInfo::~MFInfo((MFInfo *)0x84b339);
        amrex::FabArrayBase::nGrow((FabArrayBase *)local_1428._120_8_,0);
        amrex::MultiFab::Copy
                  ((MultiFab *)in_stack_ffffffffffffd930,(MultiFab *)in_stack_ffffffffffffd928,
                   (int)((ulong)in_stack_ffffffffffffd920 >> 0x20),(int)in_stack_ffffffffffffd920,
                   (int)((ulong)in_stack_ffffffffffffd918 >> 0x20),(int)in_stack_ffffffffffffd918);
        for (local_17fc = 0; (int)local_17fc < 3; local_17fc = local_17fc + 1) {
          amrex::FabArrayBase::nGrow((FabArrayBase *)local_1428._120_8_,0);
          amrex::MultiFab::Multiply
                    ((MultiFab *)in_stack_ffffffffffffd930,(MultiFab *)in_stack_ffffffffffffd928,
                     (int)((ulong)in_stack_ffffffffffffd920 >> 0x20),(int)in_stack_ffffffffffffd920,
                     (int)((ulong)in_stack_ffffffffffffd918 >> 0x20),(int)in_stack_ffffffffffffd918)
          ;
        }
      }
      NavierStokesBase::nghost_force((NavierStokesBase *)0x84b48f);
      local_1998 = 0.0;
      RStack_1990 = 0.0;
      local_19a8.data = (BARef *)0x0;
      RStack_19a0.data = (Ref *)0x0;
      local_1988._M_t.
      super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
      .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
           (tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            )(_Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              )0x0;
      amrex::MFInfo::MFInfo((MFInfo *)0x84b4cc);
      local_19b0 = (_func_int **)0x0;
      pNVar10 = (NavierStokesBase *)&local_19b0;
      amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffd900);
      amrex::MultiFab::MultiFab
                ((MultiFab *)CONCAT44(in_stack_ffffffffffffd944,in_stack_ffffffffffffd940),
                 (BoxArray *)CONCAT44(in_stack_ffffffffffffd93c,in_stack_ffffffffffffd938),
                 (DistributionMapping *)in_stack_ffffffffffffd930,
                 (int)((ulong)in_stack_ffffffffffffd928 >> 0x20),(int)in_stack_ffffffffffffd928,
                 in_stack_ffffffffffffd920,(FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffd950
                );
      amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x84b53e);
      amrex::MFInfo::~MFInfo((MFInfo *)0x84b54b);
      amrex::TilingIfNotGPU();
      amrex::MFIter::MFIter
                (in_stack_ffffffffffffd930,in_stack_ffffffffffffd928,
                 SUB81((ulong)in_stack_ffffffffffffd920 >> 0x38,0));
      while (bVar6 = amrex::MFIter::isValid((MFIter *)&stack0xffffffffffffe5f0), bVar6) {
        NavierStokesBase::nghost_force((NavierStokesBase *)0x84b5f8);
        in_stack_ffffffffffffd908 = (MFIter *)&stack0xffffffffffffe5f0;
        amrex::MFIter::growntilebox
                  (in_stack_ffffffffffffd970,(int)((ulong)in_stack_ffffffffffffd968 >> 0x20));
        pbVar4 = local_668.tags.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pFVar11 = amrex::FabArray<amrex::FArrayBox>::operator[]
                            ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd900,
                             (MFIter *)pNVar10);
        _Var5._M_pi = local_620._M_pi;
        pFVar12 = amrex::FabArray<amrex::FArrayBox>::operator[]
                            ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd900,
                             (MFIter *)pNVar10);
        pNVar10 = (NavierStokesBase *)
                  amrex::FabArray<amrex::FArrayBox>::operator[]
                            ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd900,
                             (MFIter *)pNVar10);
        in_stack_ffffffffffffd900 = (Amr *)((ulong)in_stack_ffffffffffffd900 & 0xffffffff00000000);
        (**(code **)(*(long *)pbVar4 + 0x150))
                  (_Var5._M_pi,pbVar4,pFVar11,&stack0xffffffffffffe5d4,0,in_stack_00000018,pFVar12);
        for (in_stack_ffffffffffffe5d0 = 0; (int)in_stack_ffffffffffffe5d0 < in_stack_00000018;
            in_stack_ffffffffffffe5d0 = in_stack_ffffffffffffe5d0 + 1) {
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffd910,in_stack_ffffffffffffd908,
                     (int)((ulong)in_stack_ffffffffffffd900 >> 0x20));
          in_stack_ffffffffffffe5c8 = &stack0xffffffffffffe588;
          if ((int)in_stack_ffffffffffffe5d0 < 3) {
            local_4fc._4_8_ =
                 amrex::FabArray<amrex::FArrayBox>::operator[]
                           ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd900,
                            (MFIter *)pNVar10);
            local_2d0[3] = (Ref *)(((FArrayBox *)local_4fc._4_8_)->super_BaseFab<double>).dptr;
            local_2d0[2] = (Ref *)&(((FArrayBox *)local_4fc._4_8_)->super_BaseFab<double>).domain;
            local_2d0[1]._4_4_ = (((FArrayBox *)local_4fc._4_8_)->super_BaseFab<double>).nvar;
            local_26c = 0;
            local_2d0[7]._0_4_ = (((Box *)local_2d0[2])->smallend).vect[0];
            local_27c = 1;
            local_2d0[7]._4_4_ =
                 (((FArrayBox *)local_4fc._4_8_)->super_BaseFab<double>).domain.smallend.vect[1];
            local_2e0 = *(Ref **)(((Box *)local_2d0[2])->smallend).vect;
            local_2d0[8]._4_4_ = 2;
            local_2d8 = (((FArrayBox *)local_4fc._4_8_)->super_BaseFab<double>).domain.smallend.vect
                        [2];
            local_218._M_t.
            super___uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
            .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
                 (__uniq_ptr_data<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>,_true,_true>
                  )&(((FArrayBox *)local_4fc._4_8_)->super_BaseFab<double>).domain.bigend;
            local_21c = 0;
            local_248 = ((IntVect *)
                        local_218._M_t.
                        super___uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>.
                        _M_head_impl)->vect[0] + 1;
            local_228 = &(((FArrayBox *)local_4fc._4_8_)->super_BaseFab<double>).domain.bigend;
            local_22c = 1;
            iStack_244 = (((FArrayBox *)local_4fc._4_8_)->super_BaseFab<double>).domain.bigend.vect
                         [1] + 1;
            local_238 = &(((FArrayBox *)local_4fc._4_8_)->super_BaseFab<double>).domain.bigend;
            local_23c = 2;
            local_2e8 = (((FArrayBox *)local_4fc._4_8_)->super_BaseFab<double>).domain.bigend.vect
                        [2] + 1;
            local_2f0 = (FluxRegister *)CONCAT44(iStack_244,local_248);
            local_4fc._0_4_ = in_stack_ffffffffffffe5d0;
            local_2d0[0] = local_2e0;
            local_2d0[1]._0_4_ = local_2d8;
            local_2d0[4] = local_2e0;
            local_2d0[5]._0_4_ = local_2d8;
            local_2d0[6] = local_2d0[2];
            local_2d0[8]._0_4_ = local_2d8;
            local_288 = (element_type *)local_2d0[2];
            local_278 = (element_type *)local_2d0[2];
            local_268 = (Box *)local_2d0[2];
            local_260.hp = (Array4<double> *)local_2f0;
            local_258 = local_2e8;
            local_250 = (pointer)local_2d0[2];
            local_240 = local_2e8;
            amrex::Array4<const_double>::Array4
                      (&local_540,(double *)local_2d0[3],(Dim3 *)local_2d0,(Dim3 *)&local_2f0,
                       local_2d0[1]._4_4_);
            in_stack_ffffffffffffe580 = (Array4<const_double> *)&stack0xffffffffffffe540;
            amrex::Array4<const_double>::Array4<const_double,_0>
                      (in_stack_ffffffffffffe580,&local_540,local_4fc._0_4_);
            local_548 = (pointer)amrex::FabArray<amrex::FArrayBox>::operator[]
                                           ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd900,
                                            (MFIter *)pNVar10);
            local_1c8 = (local_548->field_2)._M_allocated_capacity;
            local_1e0[1]._4_8_ = (long)&local_548->field_2 + 8;
            local_1e0[1].x = *(int *)((long)&local_548[1].field_2 + 4);
            in_stack_fffffffffffffe58 =
                 *(int *)&(((element_type *)local_1e0[1]._4_8_)->m_pmap).
                          super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
            in_stack_fffffffffffffe74 = 1;
            in_stack_fffffffffffffe5c = *(int *)((long)&local_548->field_2 + 0xc);
            local_1fc[1]._0_8_ =
                 (((element_type *)local_1e0[1]._4_8_)->m_pmap).
                 super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
            in_stack_fffffffffffffe64 = 2;
            local_1fc[1].z = *(int *)(local_548 + 1);
            in_stack_fffffffffffffed8 = (Geometry *)&local_548[1].field_0x4;
            in_stack_fffffffffffffed4 = 0;
            in_stack_fffffffffffffea8 = *(int *)in_stack_fffffffffffffed8 + 1;
            in_stack_fffffffffffffec8.data = (BARef *)&local_548[1].field_0x4;
            in_stack_fffffffffffffec4 = 1;
            in_stack_fffffffffffffeb8 = &local_548[1].field_0x4;
            in_stack_fffffffffffffeb4 = 2;
            local_208 = *(int *)((long)&local_548[1]._M_string_length + 4) + 1;
            local_210._M_t.
            super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
            .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl._4_4_ =
                 (int)local_548[1]._M_string_length + 1;
            local_210._M_t.
            super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
            .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl._0_4_ =
                 in_stack_fffffffffffffea8;
            local_54c = in_stack_ffffffffffffe5d0;
            local_1fc[0]._0_8_ =
                 local_210._M_t.
                 super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl;
            local_1fc[0].z = local_208;
            local_1e0[0]._0_8_ = local_1fc[1]._0_8_;
            local_1e0[0].z = local_1fc[1].z;
            in_stack_fffffffffffffe40 = local_1fc[1]._0_8_;
            in_stack_fffffffffffffe48 = local_1fc[1].z;
            in_stack_fffffffffffffe50._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0[1]._4_8_;
            in_stack_fffffffffffffe60 = local_1fc[1].z;
            in_stack_fffffffffffffe68 = (element_type *)local_1e0[1]._4_8_;
            in_stack_fffffffffffffe78 = (element_type *)local_1e0[1]._4_8_;
            in_stack_fffffffffffffe90._M_head_impl =
                 (FabArray<amrex::FArrayBox> *)
                 local_210._M_t.
                 super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl;
            in_stack_fffffffffffffe98 = local_208;
            in_stack_fffffffffffffea0 = (element_type *)local_1e0[1]._4_8_;
            in_stack_fffffffffffffeb0 = local_208;
            amrex::Array4<const_double>::Array4
                      (&local_590,(double *)local_1c8,local_1e0,local_1fc,local_1e0[1].x);
            amrex::Array4<const_double>::Array4<const_double,_0>(&local_1b08,&local_590,local_54c);
            local_1ac8 = &local_1b08;
            if (in_stack_00000020 == 0) {
              local_4fc._20_8_ =
                   amrex::FabArray<amrex::FArrayBox>::operator[]
                             ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd900,
                              (MFIter *)pNVar10);
              local_498._M_t.
              super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
              .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
                   (tuple<amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                    )(((FArrayBox *)local_4fc._20_8_)->super_BaseFab<double>).dptr;
              local_4a0._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   &(((FArrayBox *)local_4fc._20_8_)->super_BaseFab<double>).domain;
              local_4a4 = (((FArrayBox *)local_4fc._20_8_)->super_BaseFab<double>).nvar;
              BStack_474.m_bndryReg.m_hishft.vect[2] = 0;
              local_478 = (((Box *)local_4a0._M_pi)->smallend).vect[0];
              BStack_474.m_bndryReg.m_loshft.vect[1] = 1;
              BStack_474.m_indexType.m_typ.itype =
                   (BATindexType)
                   (((FArrayBox *)local_4fc._20_8_)->super_BaseFab<double>).domain.smallend.vect[1];
              local_4fc._60_8_ = *(undefined8 *)(((Box *)local_4a0._M_pi)->smallend).vect;
              BStack_474.m_bndryReg.m_crse_ratio.vect[0] = 2;
              local_4b8 = (((FArrayBox *)local_4fc._20_8_)->super_BaseFab<double>).domain.smallend.
                          vect[2];
              local_428 = (((FArrayBox *)local_4fc._20_8_)->super_BaseFab<double>).domain.bigend.
                          vect[0] + 1;
              iStack_424 = (((FArrayBox *)local_4fc._20_8_)->super_BaseFab<double>).domain.bigend.
                           vect[1] + 1;
              local_4fc._36_4_ =
                   (((FArrayBox *)local_4fc._20_8_)->super_BaseFab<double>).domain.bigend.vect[2] +
                   1;
              local_4fc._32_4_ = iStack_424;
              local_4fc._28_4_ = local_428;
              local_4fc._48_8_ = local_4fc._28_8_;
              local_4fc._56_4_ = local_4fc._36_4_;
              local_4b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4fc._60_8_;
              local_4a8 = local_4b8;
              local_490._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4fc._60_8_;
              local_488 = local_4b8;
              local_480 = (Box *)local_4a0._M_pi;
              BStack_474.m_bndryReg.m_typ.itype = (IndexType)local_4b8;
              BStack_474._12_8_ = local_4a0._M_pi;
              BStack_474._28_8_ = local_4a0._M_pi;
              BStack_474._44_8_ = local_4a0._M_pi;
              BStack_474._52_8_ = local_4fc._28_8_;
              BStack_474.m_bndryReg.m_doihi.vect[1] = local_4fc._36_4_;
              local_430.data = (Ref *)local_4a0._M_pi;
              amrex::Array4<const_double>::Array4
                        (&local_1b50,
                         (double *)
                         local_498._M_t.
                         super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>.
                         _M_head_impl,(Dim3 *)&local_4b0,(Dim3 *)(local_4fc + 0x30),local_4a4);
              local_1b10 = &local_1b50;
              memcpy(&stack0xffffffffffffe3b0,(void *)in_stack_ffffffffffffe5c8,0x3c);
              memcpy(&stack0xffffffffffffe3f0,in_stack_ffffffffffffe580,0x3c);
              memcpy(&stack0xffffffffffffe430,local_1ac8,0x3c);
              memcpy(&stack0xffffffffffffe470,local_1b10,0x3c);
              amrex::
              ParallelFor<MacProj::mac_sync_compute(int,std::array<amrex::MultiFab*,3ul>&,amrex::MultiFab*,amrex::MultiFab&,amrex::MultiFab&,amrex::FluxRegister*,amrex::Vector<AdvectionForm,std::allocator<AdvectionForm>>&,double,double,int,double,int,bool)::__0>
                        (in_stack_ffffffffffffd950,in_stack_ffffffffffffd948);
            }
            else {
              memcpy(local_1d10,(void *)in_stack_ffffffffffffe5c8,0x3c);
              memcpy(auStack_1cd0,in_stack_ffffffffffffe580,0x3c);
              memcpy(auStack_1c90,local_1ac8,0x3c);
              amrex::
              ParallelFor<MacProj::mac_sync_compute(int,std::array<amrex::MultiFab*,3ul>&,amrex::MultiFab*,amrex::MultiFab&,amrex::MultiFab&,amrex::FluxRegister*,amrex::Vector<AdvectionForm,std::allocator<AdvectionForm>>&,double,double,int,double,int,bool)::__1>
                        (in_stack_ffffffffffffd950,
                         (anon_class_192_3_12216b5a *)in_stack_ffffffffffffd948);
            }
          }
          else {
            pFVar11 = amrex::FabArray<amrex::FArrayBox>::operator[]
                                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd900,
                                 (MFIter *)pNVar10);
            local_d8.hp = (Array4<const_double> *)(pFVar11->super_BaseFab<double>).dptr;
            local_e0.hp = (Array4<double> *)&(pFVar11->super_BaseFab<double>).domain;
            local_e4 = (pFVar11->super_BaseFab<double>).nvar;
            local_8c = 0;
            local_b8 = (((Box *)local_e0.hp)->smallend).vect[0];
            local_9c = 1;
            iStack_b4 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[1];
            local_f0 = *(pointer *)(((Box *)local_e0.hp)->smallend).vect;
            local_ac = 2;
            local_e8 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[2];
            local_38 = &(pFVar11->super_BaseFab<double>).domain.bigend;
            local_3c = 0;
            local_68 = ((IntVect *)local_38)->vect[0] + 1;
            local_48 = &(pFVar11->super_BaseFab<double>).domain.bigend;
            local_4c = 1;
            uStack_64 = (pFVar11->super_BaseFab<double>).domain.bigend.vect[1] + 1;
            local_58 = &(pFVar11->super_BaseFab<double>).domain.bigend;
            local_5c = 2;
            local_78 = (pFVar11->super_BaseFab<double>).domain.bigend.vect[2] + 1;
            in_stack_fffffffffffffee0 = (string *)CONCAT44(uStack_64,local_68);
            uVar23 = in_stack_ffffffffffffe5d0;
            in_stack_fffffffffffffef0.m_arena = (Arena *)in_stack_fffffffffffffee0;
            local_d0 = local_f0;
            local_c8 = local_e8;
            local_c0 = (pointer)local_e0.hp;
            local_b0 = local_e8;
            local_a8 = (Box *)local_e0.hp;
            local_98._M_t.
            super___uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
            .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
                 (__uniq_ptr_data<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>,_true,_true>
                  )(__uniq_ptr_data<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>,_true,_true>
                    )local_e0.hp;
            local_88 = (Box *)local_e0.hp;
            local_80 = in_stack_fffffffffffffee0;
            local_70 = (Box *)local_e0.hp;
            local_60 = local_78;
            amrex::Array4<const_double>::Array4
                      ((Array4<const_double> *)&stack0xfffffffffffffa20,(double *)local_d8.hp,
                       (Dim3 *)&local_f0,(Dim3 *)&stack0xfffffffffffffef0,local_e4);
            amrex::Array4<const_double>::Array4<const_double,_0>
                      (&local_1d58,(Array4<const_double> *)&stack0xfffffffffffffa20,
                       in_stack_ffffffffffffe5d0);
            local_1d18 = &local_1d58;
            local_4fc._12_8_ =
                 amrex::FabArray<amrex::FArrayBox>::operator[]
                           ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd900,
                            (MFIter *)pNVar10);
            local_3dc.z = (((FArrayBox *)local_4fc._12_8_)->super_BaseFab<double>).domain.bigend.
                          vect[2] + 1;
            local_3dc.y = (((FArrayBox *)local_4fc._12_8_)->super_BaseFab<double>).domain.bigend.
                          vect[1] + 1;
            local_3dc.x = (((FArrayBox *)local_4fc._12_8_)->super_BaseFab<double>).domain.bigend.
                          vect[0] + 1;
            amrex::Array4<const_double>::Array4
                      (&local_1da0,(((FArrayBox *)local_4fc._12_8_)->super_BaseFab<double>).dptr,
                       (Dim3 *)&stack0xfffffffffffffc40,&local_3dc,
                       (((FArrayBox *)local_4fc._12_8_)->super_BaseFab<double>).nvar);
            local_1d60 = &local_1da0;
            if ((NavierStokesBase::do_temp == 0) || (uVar23 != NavierStokesBase::Temp)) {
              pAVar14 = amrex::Vector<AdvectionForm,_std::allocator<AdvectionForm>_>::operator[]
                                  ((Vector<AdvectionForm,_std::allocator<AdvectionForm>_> *)
                                   in_stack_ffffffffffffd900,(size_type)pNVar10);
              if (*pAVar14 == Conservative) {
                memcpy(local_1ee0,(void *)in_stack_ffffffffffffe5c8,0x3c);
                memcpy(auStack_1ea0,local_1d18,0x3c);
                amrex::
                ParallelFor<MacProj::mac_sync_compute(int,std::array<amrex::MultiFab*,3ul>&,amrex::MultiFab*,amrex::MultiFab&,amrex::MultiFab&,amrex::FluxRegister*,amrex::Vector<AdvectionForm,std::allocator<AdvectionForm>>&,double,double,int,double,int,bool)::__3>
                          (in_stack_ffffffffffffd950,
                           (anon_class_128_2_174954f6 *)in_stack_ffffffffffffd948);
                in_stack_ffffffffffffe5d0 = uVar23;
              }
              else {
                memcpy(local_1fa0,(void *)in_stack_ffffffffffffe5c8,0x3c);
                memcpy(auStack_1f60,local_1d18,0x3c);
                memcpy(&stack0xffffffffffffe0e0,local_1d60,0x3c);
                amrex::
                ParallelFor<MacProj::mac_sync_compute(int,std::array<amrex::MultiFab*,3ul>&,amrex::MultiFab*,amrex::MultiFab&,amrex::MultiFab&,amrex::FluxRegister*,amrex::Vector<AdvectionForm,std::allocator<AdvectionForm>>&,double,double,int,double,int,bool)::__4>
                          (in_stack_ffffffffffffd950,
                           (anon_class_192_3_99a582fc *)in_stack_ffffffffffffd948);
                in_stack_ffffffffffffe5d0 = uVar23;
              }
            }
            else {
              memcpy(local_1e60,(void *)in_stack_ffffffffffffe5c8,0x3c);
              memcpy(auStack_1e20,local_1d18,0x3c);
              memcpy(auStack_1de0,local_1d60,0x3c);
              amrex::
              ParallelFor<MacProj::mac_sync_compute(int,std::array<amrex::MultiFab*,3ul>&,amrex::MultiFab*,amrex::MultiFab&,amrex::MultiFab&,amrex::FluxRegister*,amrex::Vector<AdvectionForm,std::allocator<AdvectionForm>>&,double,double,int,double,int,bool)::__2>
                        (in_stack_ffffffffffffd950,
                         (anon_class_192_3_99a582fc *)in_stack_ffffffffffffd948);
              in_stack_ffffffffffffe5d0 = uVar23;
            }
          }
        }
        amrex::MFIter::operator++((MFIter *)&stack0xffffffffffffe5f0);
      }
      amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffd900);
      for (local_1fa4 = 0; local_1fa4 < in_stack_00000018; local_1fa4 = local_1fa4 + 1) {
        if (local_1fa4 < 3) {
          local_2384 = local_1fa4;
        }
        else {
          local_2384 = local_1fa4 + -3;
        }
        local_1fa8 = local_2384;
        if (local_1fa4 < 3) {
          local_2390._M_head_impl = (FabArray<amrex::FArrayBox> *)local_610._M_pi;
        }
        else {
          local_2390._M_head_impl = local_618._M_head_impl;
        }
        local_1fb0 = local_2390._M_head_impl;
        local_1fb1 = -(local_1fa4 < 3) & 1;
        if (local_1fa4 < 3) {
          pBVar13 = NavierStokesBase::get_bcrec_velocity_d_ptr((NavierStokesBase *)0x84c912);
          local_2398 = (NavierStokesBase *)(pBVar13 + local_1fa8);
          pNVar18 = pNVar10;
          pAVar19 = in_stack_ffffffffffffd900;
        }
        else {
          pBVar13 = NavierStokesBase::get_bcrec_scalars_d_ptr((NavierStokesBase *)0x84c938);
          local_2398 = (NavierStokesBase *)(pBVar13 + local_1fa8);
          pNVar18 = pNVar10;
          pAVar19 = in_stack_ffffffffffffd900;
        }
        local_1fc0 = local_2398;
        if ((in_stack_00000020 == 1) && (local_1fa4 < 3)) {
          local_23a0 = &local_17d0;
        }
        else {
          local_23a0 = (FabArrayBase *)local_1428._120_8_;
        }
        local_1fc8 = local_23a0;
        amrex::PODVector<int,_std::allocator<int>_>::PODVector
                  ((PODVector<int,_std::allocator<int>_> *)pAVar19);
        amrex::Vector<int,_std::allocator<int>_>::Vector
                  ((Vector<int,_std::allocator<int>_> *)0x84c9cf);
        amrex::PODVector<int,_std::allocator<int>_>::resize
                  ((PODVector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd910,
                   (size_type)in_stack_ffffffffffffd908);
        local_1ffc = 0;
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd930,
                   (size_type)in_stack_ffffffffffffd928,(value_type *)in_stack_ffffffffffffd920);
        local_2000 = 0;
        while( true ) {
          uVar23 = (undefined4)((ulong)in_stack_ffffffffffffd970 >> 0x20);
          uVar21 = (undefined4)((ulong)in_stack_ffffffffffffd998 >> 0x20);
          iVar20 = (int)((ulong)in_stack_ffffffffffffd980 >> 0x20);
          if (0 < local_2000) break;
          pAVar14 = amrex::Vector<AdvectionForm,_std::allocator<AdvectionForm>_>::operator[]
                              ((Vector<AdvectionForm,_std::allocator<AdvectionForm>_> *)pAVar19,
                               (size_type)pNVar18);
          AVar1 = *pAVar14;
          puVar15 = (uint *)amrex::Vector<int,_std::allocator<int>_>::operator[]
                                      ((Vector<int,_std::allocator<int>_> *)pAVar19,
                                       (size_type)pNVar18);
          *puVar15 = (uint)(AVar1 == Conservative);
          local_2000 = local_2000 + 1;
        }
        local_2010 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                      ((vector<int,_std::allocator<int>_> *)pNVar18);
        local_2018 = (int *)std::vector<int,_std::allocator<int>_>::end
                                      ((vector<int,_std::allocator<int>_> *)pNVar18);
        piVar16 = amrex::PODVector<int,_std::allocator<int>_>::begin(&local_1fe0);
        amrex::Gpu::
        copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*>
                  (local_2010,local_2018,piVar16);
        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )pAVar19,(char *)pNVar18);
        local_2019 = -bVar6 & 1;
        NavierStokesBase::EBFactory((NavierStokesBase *)0x84cb3a);
        bVar6 = amrex::EBFArrayBoxFactory::isAllRegular((EBFArrayBoxFactory *)0x84cb42);
        if (bVar6) {
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)pAVar19,(char *)pNVar18);
          if ((bVar6) && ((local_1fb1 & 1) == 0)) {
            pNVar10 = (NavierStokesBase *)(local_608 + 1);
            in_stack_ffffffffffffd900 = (Amr *)(local_608 + 2);
            ppMVar17 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                                 ((array<amrex::MultiFab_*,_3UL> *)pAVar19,(size_type)pNVar18);
            in_stack_ffffffffffffd908 = (MFIter *)*ppMVar17;
            ppMVar17 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                                 ((array<amrex::MultiFab_*,_3UL> *)pAVar19,(size_type)pNVar18);
            in_stack_ffffffffffffd910 = &(*ppMVar17)->super_FabArray<amrex::FArrayBox>;
            std::array<amrex::MultiFab_*,_3UL>::operator[]
                      ((array<amrex::MultiFab_*,_3UL> *)pAVar19,(size_type)pNVar18);
            iVar20 = local_1fa4;
            in_stack_ffffffffffffd920 = local_f68;
            in_stack_ffffffffffffd928 = &local_de8;
            in_stack_ffffffffffffd930 = local_c68;
            in_stack_ffffffffffffd978 =
                 (NavierStokesBase *)
                 std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                           ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                            pAVar19);
            in_stack_ffffffffffffd998 =
                 (PODVector<int,_std::allocator<int>_> *)
                 (CONCAT44(uVar21,(uint)local_1fb1) & 0xffffffff00000001);
            in_stack_ffffffffffffd990 = (NavierStokesBase *)&local_1fe0;
            in_stack_ffffffffffffd970 = (MFIter *)CONCAT44(uVar23,iVar20);
            in_stack_ffffffffffffd980 = local_1fc0;
            in_stack_ffffffffffffd988 =
                 (NavierStokesBase *)
                 local_668.tags.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            BDS::ComputeSyncAofs
                      ((MultiFab *)CONCAT44(in_stack_ffffffffffffe3d4,in_stack_ffffffffffffe3d0),
                       in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8,
                       (MultiFab *)CONCAT17(in_stack_ffffffffffffe3c7,in_stack_ffffffffffffe3c0),
                       in_stack_ffffffffffffe3bc,
                       (MultiFab *)
                       CONCAT17(in_stack_ffffffffffffe3b7,
                                CONCAT16(in_stack_ffffffffffffe3b6,
                                         CONCAT15(in_stack_ffffffffffffe3b5,
                                                  in_stack_ffffffffffffe3b0))),
                       in_stack_ffffffffffffe570,in_stack_ffffffffffffe578,
                       (MultiFab *)in_stack_ffffffffffffe580,in_stack_ffffffffffffe588,
                       in_stack_ffffffffffffe590,(MultiFab *)in_stack_ffffffffffffe598,
                       (MultiFab *)in_stack_ffffffffffffe5a0,(MultiFab *)in_stack_ffffffffffffe5a8,
                       in_stack_ffffffffffffe5b0,(bool)in_stack_ffffffffffffe3af,
                       (MultiFab *)CONCAT44(in_stack_ffffffffffffe5c4,in_stack_ffffffffffffe5c0),
                       (MultiFab *)in_stack_ffffffffffffe5c8,
                       (MultiFab *)CONCAT44(in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0),
                       in_stack_ffffffffffffe5d8,(MultiFab *)in_stack_ffffffffffffe5e0._M_pi,
                       in_stack_ffffffffffffe5e8,(MultiFab *)in_stack_ffffffffffffe5f0._M_head_impl,
                       (BCRec *)CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8),
                       (Geometry *)in_stack_ffffffffffffe600._M_pi,in_stack_ffffffffffffe608,
                       (Real)in_stack_ffffffffffffe3a0,(bool)in_stack_ffffffffffffe39f);
          }
          else {
            pNVar10 = (NavierStokesBase *)(local_608 + 1);
            in_stack_ffffffffffffd900 = (Amr *)(local_608 + 2);
            ppMVar17 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                                 ((array<amrex::MultiFab_*,_3UL> *)pAVar19,(size_type)pNVar18);
            uVar22 = (undefined4)((ulong)in_stack_ffffffffffffd9a8 >> 0x20);
            in_stack_ffffffffffffd908 = (MFIter *)*ppMVar17;
            ppMVar17 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                                 ((array<amrex::MultiFab_*,_3UL> *)pAVar19,(size_type)pNVar18);
            in_stack_ffffffffffffd910 = &(*ppMVar17)->super_FabArray<amrex::FArrayBox>;
            std::array<amrex::MultiFab_*,_3UL>::operator[]
                      ((array<amrex::MultiFab_*,_3UL> *)pAVar19,(size_type)pNVar18);
            iVar20 = local_1fa4;
            in_stack_ffffffffffffd920 = local_f68;
            in_stack_ffffffffffffd928 = &local_de8;
            in_stack_ffffffffffffd930 = local_c68;
            in_stack_ffffffffffffd978 =
                 (NavierStokesBase *)
                 std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                           ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                            pAVar19);
            in_stack_ffffffffffffd988 =
                 (NavierStokesBase *)
                 local_668.tags.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            in_stack_ffffffffffffd980 = local_1fc0;
            bVar2 = local_2019;
            bVar6 = NavierStokesBase::GodunovUseForcesInTrans();
            in_stack_ffffffffffffd9a8 =
                 (string *)(CONCAT44(uVar22,(uint)local_1fb1) & 0xffffffff00000001);
            in_stack_ffffffffffffd9a0 = (uint)bVar6;
            in_stack_ffffffffffffd998 =
                 (PODVector<int,_std::allocator<int>_> *)
                 (CONCAT44(uVar21,(uint)bVar2) & 0xffffffff00000001);
            in_stack_ffffffffffffd990 = (NavierStokesBase *)&local_1fe0;
            in_stack_ffffffffffffd970 = (MFIter *)CONCAT44(uVar23,iVar20);
            Godunov::ComputeSyncAofs
                      (in_stack_ffffffffffffe3e8,in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0
                       ,(MultiFab *)in_stack_ffffffffffffe3d8._M_pi,in_stack_ffffffffffffe3d4,
                       (MultiFab *)CONCAT44(in_stack_ffffffffffffe3cc,in_stack_ffffffffffffe3c8),
                       (MultiFab *)in_stack_ffffffffffffe580,in_stack_ffffffffffffe588,
                       in_stack_ffffffffffffe590,(MultiFab *)in_stack_ffffffffffffe598,
                       (MultiFab *)in_stack_ffffffffffffe5a0,(MultiFab *)in_stack_ffffffffffffe5a8,
                       (MultiFab *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                       (MultiFab *)in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5c0,
                       (bool)in_stack_ffffffffffffe3c7,
                       (MultiFab *)CONCAT44(in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0),
                       (MultiFab *)CONCAT44(in_stack_ffffffffffffe5dc,in_stack_ffffffffffffe5d8),
                       (MultiFab *)in_stack_ffffffffffffe5e0._M_pi,in_stack_ffffffffffffe5e8,
                       (MultiFab *)in_stack_ffffffffffffe5f0._M_head_impl,in_stack_ffffffffffffe5f8,
                       (MultiFab *)in_stack_ffffffffffffe600._M_pi,
                       (BCRec *)in_stack_ffffffffffffe608,in_stack_ffffffffffffe610,
                       in_stack_ffffffffffffe618,
                       (Real)CONCAT44(in_stack_ffffffffffffe3bc,in_stack_ffffffffffffe3b8),
                       (bool)in_stack_ffffffffffffe3b7,(bool)in_stack_ffffffffffffe3b6,
                       (bool)in_stack_ffffffffffffe3b5);
          }
        }
        else {
          std::allocator<amrex::BCRec>::allocator((allocator<amrex::BCRec> *)0x84cb5f);
          amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                    ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)pAVar19,
                     (size_type)pNVar18,(allocator_type *)0x84cb79);
          std::allocator<amrex::BCRec>::~allocator((allocator<amrex::BCRec> *)0x84cb88);
          NavierStokesBase::fetchBCArray
                    (in_stack_ffffffffffffd990,(int)((ulong)in_stack_ffffffffffffd988 >> 0x20),
                     (int)in_stack_ffffffffffffd988,iVar20);
          amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator=
                    ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)pAVar19,
                     (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)pNVar18);
          amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
                    ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x84cbd8);
          pNVar10 = (NavierStokesBase *)(local_608 + 1);
          in_stack_ffffffffffffd900 = (Amr *)(local_608 + 2);
          ppMVar17 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                               ((array<amrex::MultiFab_*,_3UL> *)pAVar19,(size_type)pNVar18);
          in_stack_ffffffffffffd908 = (MFIter *)*ppMVar17;
          ppMVar17 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                               ((array<amrex::MultiFab_*,_3UL> *)pAVar19,(size_type)pNVar18);
          in_stack_ffffffffffffd910 = &(*ppMVar17)->super_FabArray<amrex::FArrayBox>;
          std::array<amrex::MultiFab_*,_3UL>::operator[]
                    ((array<amrex::MultiFab_*,_3UL> *)pAVar19,(size_type)pNVar18);
          iVar20 = local_1fa4;
          in_stack_ffffffffffffd920 = local_f68;
          in_stack_ffffffffffffd928 = &local_de8;
          in_stack_ffffffffffffd930 = local_c68;
          in_stack_ffffffffffffd978 =
               (NavierStokesBase *)
               std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                         ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          pAVar19);
          in_stack_ffffffffffffd990 =
               (NavierStokesBase *)
               local_668.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          bVar2 = local_1fb1;
          in_stack_ffffffffffffd988 = local_1fc0;
          std::__cxx11::string::string
                    (local_2078,(string *)&NavierStokesBase::redistribution_type_abi_cxx11_);
          in_stack_ffffffffffffd9a8 = local_2078;
          in_stack_ffffffffffffd9a0 = bVar2 & 1;
          in_stack_ffffffffffffd998 = &local_1fe0;
          in_stack_ffffffffffffd980 = (NavierStokesBase *)(local_2078 + 0x40);
          in_stack_ffffffffffffd970 = (MFIter *)CONCAT44(uVar23,iVar20);
          EBGodunov::ComputeSyncAofs
                    ((MultiFab *)in_stack_fffffffffffffa38,in_stack_fffffffffffffa34,
                     in_stack_fffffffffffffa30,(MultiFab *)in_stack_fffffffffffffa28,
                     in_stack_fffffffffffffa24,(MultiFab *)in_stack_fffffffffffffa18,
                     (MultiFab *)in_stack_fffffffffffffe40,
                     (MultiFab *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                     (MultiFab *)in_stack_fffffffffffffe50._M_pi,
                     (MultiFab *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     (MultiFab *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     (MultiFab *)in_stack_fffffffffffffe68,
                     (MultiFab *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     (MultiFab *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe80,
                     (bool)(char)((ulong)in_RDI >> 0x38),
                     (MultiFab *)in_stack_fffffffffffffe90._M_head_impl,
                     (MultiFab *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                     (MultiFab *)in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,
                     (MultiFab *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (int)in_stack_fffffffffffffeb8,
                     (MultiFab *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                     in_stack_fffffffffffffec8.data,
                     (BCRec *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffed8,(DeviceVector<int> *)in_stack_fffffffffffffee0,
                     (Real)CONCAT44(in_ESI,in_stack_fffffffffffffa08),SUB81((ulong)in_RDX >> 0x38,0)
                     ,(string *)in_stack_fffffffffffffef0.m_arena);
          std::__cxx11::string::~string(local_2078);
          amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
                    ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x84cefb);
        }
        amrex::Vector<int,_std::allocator<int>_>::~Vector
                  ((Vector<int,_std::allocator<int>_> *)0x84d559);
        amrex::PODVector<int,_std::allocator<int>_>::~PODVector
                  ((PODVector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd900);
      }
      amrex::MultiFab::~MultiFab((MultiFab *)0x84d5a5);
      amrex::MultiFab::~MultiFab((MultiFab *)0x84d5b2);
      amrex::FillPatchIterator::~FillPatchIterator((FillPatchIterator *)in_stack_ffffffffffffd900);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_ffffffffffffd900);
    }
    else {
      amrex::Abort_host((char *)in_stack_ffffffffffffd910);
    }
  }
  if ((0 < (int)in_ESI) && ((local_631 & 1) != 0)) {
    amrex::Amr::nCycle(in_stack_ffffffffffffd900,(int)((ulong)pNVar10 >> 0x20));
    for (local_2084 = 0; local_2084 < 3; local_2084 = local_2084 + 1) {
      for (local_2088 = 0; local_2088 < in_stack_00000018; local_2088 = local_2088 + 1) {
        amrex::FluxRegister::FineAdd
                  ((FluxRegister *)in_stack_ffffffffffffd990,(MultiFab *)in_stack_ffffffffffffd988,
                   (int)((ulong)in_stack_ffffffffffffd980 >> 0x20),(int)in_stack_ffffffffffffd980,
                   (int)((ulong)in_stack_ffffffffffffd978 >> 0x20),(int)in_stack_ffffffffffffd978,
                   (Real)in_stack_ffffffffffffd970);
      }
      amrex::
      Vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                    *)in_stack_ffffffffffffd900,(size_type)pNVar10);
      std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>::operator->
                ((unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_> *)
                 0x84d72f);
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffd900,(size_type)pNVar10);
      pNVar10 = (NavierStokesBase *)CONCAT44((int)((ulong)pNVar10 >> 0x20),1);
      amrex::FluxRegister::FineAdd
                (in_stack_ffffffffffffd9b0,(MultiFab *)in_stack_ffffffffffffd9a8,
                 (MultiFab *)CONCAT44(in_stack_ffffffffffffd9a4,in_stack_ffffffffffffd9a0),
                 (int)((ulong)in_stack_ffffffffffffd998 >> 0x20),(int)in_stack_ffffffffffffd998,
                 (int)((ulong)in_stack_ffffffffffffd990 >> 0x20),in_stack_ffffffffffffd9c0,
                 (Real)in_stack_ffffffffffffd988);
    }
  }
  amrex::FillPatchIterator::~FillPatchIterator((FillPatchIterator *)in_stack_ffffffffffffd900);
  amrex::MultiFab::~MultiFab((MultiFab *)0x84d7c7);
  local_25f8 = &local_ae8;
  do {
    local_25f8 = (MFInfo *)&local_25f8[-10].tags;
    amrex::MultiFab::~MultiFab((MultiFab *)0x84d801);
  } while (local_25f8 != local_f68);
  local_2610 = &local_668;
  do {
    local_2610 = (MFInfo *)&local_2610[-10].tags;
    amrex::MultiFab::~MultiFab((MultiFab *)0x84d858);
  } while (local_2610 != &local_ae8);
  return;
}

Assistant:

void
MacProj::mac_sync_compute (int                   level,
                           Array<MultiFab*,AMREX_SPACEDIM>& Ucorr,
                           MultiFab*             u_mac,
                           MultiFab&             Vsync,
                           MultiFab&             Ssync,
                           FluxRegister*         adv_flux_reg,
                           Vector<AdvectionForm>& advectionType,
                           Real                  prev_time,
                           Real                  dt,
                           int                   num_state_comps,
                           Real                  be_cn_theta,
                           int                   do_mom_diff,
                           bool                  update_fluxreg)
{
    //
    // Get parameters.
    //
    const BoxArray& grids               = LevelData[level]->boxArray();
    const DistributionMapping& dmap     = LevelData[level]->DistributionMap();
    const Geometry& geom                = parent->Geom(level);
    NavierStokesBase&   ns_level        = *(NavierStokesBase*) &(parent->getLevel(level));
    const MultiFab* area                = ns_level.Area();

    // Only two options: do all state components (including velocity) or just the
    // velocity components. Anything else will likely cause problems with the
    // mac register update.
    AMREX_ASSERT(num_state_comps == AMREX_SPACEDIM || num_state_comps == ns_level.NUM_STATE);

    const int  ncomp = 1;         // Number of components to process at once

    const int  nghost  = 0;

    //
    // Prep MFs to store fluxes and edge states
    //
    MultiFab fluxes[AMREX_SPACEDIM];
    MultiFab edgestate[AMREX_SPACEDIM];

    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        const BoxArray& ba = LevelData[level]->getEdgeBoxArray(i);
        fluxes[i].define(ba, dmap, num_state_comps, nghost, MFInfo(),ns_level.Factory());
        edgestate[i].define(ba, dmap, ncomp, nghost, MFInfo(), ns_level.Factory());
    }

    // Visc terms, is not used for MOL but we define it here anyways as base for the following
    // FillPatch operator
    MultiFab visc_terms(grids,dmap,num_state_comps,ns_level.nghost_force(),
                        MFInfo(),ns_level.Factory());
    FillPatchIterator S_fpi(ns_level,visc_terms,ns_level.nghost_state(),
                            prev_time,State_Type,0,num_state_comps);
    MultiFab& Smf = S_fpi.get_mf();

    //
    // Compute the mac sync correction.
    //
    if (ns_level.advection_scheme == "MOL")
    {
        Vector<BCRec>  math_bcs(ncomp);

        for (int comp = 0; comp < num_state_comps; ++comp)
        {
            // Get BCs for this component
            math_bcs = ns_level.fetchBCArray(State_Type, comp, ncomp);

            // Select sync MF and its component for processing
            const int  sync_comp = comp < AMREX_SPACEDIM ? comp   : comp-AMREX_SPACEDIM;
            MultiFab*  sync_ptr  = comp < AMREX_SPACEDIM ? &Vsync : &Ssync;
            bool    is_velocity  = comp < AMREX_SPACEDIM ? true   : false;

            BCRec  const* d_bcrec_ptr = comp < AMREX_SPACEDIM
                                               ? ns_level.get_bcrec_velocity_d_ptr()
                                               : ns_level.get_bcrec_scalars_d_ptr();

#ifdef AMREX_USE_EB
            if ( !(ns_level.EBFactory().isAllRegular()) )
            {
                EBMOL::ComputeSyncAofs(*sync_ptr, sync_comp, ncomp, Smf, comp,
                                       D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                       D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                       D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                                       D_DECL(fluxes[0],fluxes[1],fluxes[2]), comp,
                                       math_bcs, &d_bcrec_ptr[sync_comp], geom, dt,
                                       is_velocity, ns_level.redistribution_type );
            }
            else
#endif
            {
                MOL::ComputeSyncAofs(*sync_ptr, sync_comp, ncomp, Smf, comp,
                                     D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                     D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                     D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                                     D_DECL(fluxes[0],fluxes[1],fluxes[2]), comp,
                                     math_bcs, &d_bcrec_ptr[sync_comp], geom, is_velocity );
            }
        }
    }
    else if ( ns_level.advection_scheme == "Godunov_PLM" ||
              ns_level.advection_scheme == "Godunov_PPM" ||
              ns_level.advection_scheme == "BDS" )
    {
        std::unique_ptr<MultiFab> divu_fp (ns_level.getDivCond(ns_level.nghost_force(),prev_time));

        MultiFab& Gp = ns_level.get_old_data(Gradp_Type);

        visc_terms.setVal(0.0); // Initialize to make calls below safe

        // Get viscous forcing.
        if (be_cn_theta != 1.0)
        {
            ns_level.getViscTerms(visc_terms,0,num_state_comps,prev_time);
        }

        // Get density -- this isn't really needed if doing all of the state components...
        FillPatchIterator rho_fpi(ns_level,visc_terms,ns_level.nghost_state(),
                                  prev_time,State_Type,Density,1);
        MultiFab& rhoMF = rho_fpi.get_mf();

        // FIXME? - not sure we really need this momenta MF; could probably do with a
        // temporary FAB in the sync loop...
        //
        // Store momenta multifab if conservative approach is used,
        // i.e. rho* u.
        // We make it with AMREX_SPACEDIM components instead of only one
        // (loop below is done component by component) because ComputeSyncAofs will
        // need to know which component of velocity is being processed.
        MultiFab momenta;
        if  (do_mom_diff == 1)
        {
            momenta.define(grids,dmap, AMREX_SPACEDIM, Smf.nGrow(), MFInfo(), Smf.Factory());
            MultiFab::Copy(momenta,Smf,0,0,AMREX_SPACEDIM, Smf.nGrow());
            for (int d=0; d < AMREX_SPACEDIM; ++d )
                MultiFab::Multiply( momenta, rhoMF, 0, d, 1, Smf.nGrow());
        }


        //
        // Compute forcing terms
        //
        MultiFab forcing_term(grids, dmap, num_state_comps, ns_level.nghost_force());

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter Smfi(Smf,TilingIfNotGPU()); Smfi.isValid(); ++Smfi)
        {
            auto const gbx = Smfi.growntilebox(ns_level.nghost_force());

            //
            // Compute total forcing terms.
            //
            ns_level.getForce(forcing_term[Smfi],gbx,0,num_state_comps,
                              prev_time,Smf[Smfi],rhoMF[Smfi],0,Smfi);

            for (int comp = 0; comp < num_state_comps; ++comp)
            {
                auto const& tf    = forcing_term.array(Smfi,comp);

                if (comp < AMREX_SPACEDIM)  // Velocity/Momenta
                {
                    auto const& visc = visc_terms[Smfi].const_array(comp);
                    auto const& gp   = Gp[Smfi].const_array(comp);

                    if ( do_mom_diff == 0 )
                    {
                        auto const& rho   = rhoMF[Smfi].const_array();

                        amrex::ParallelFor(gbx, [tf, visc, gp, rho]
                        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                        {
                            tf(i,j,k)  += visc(i,j,k) - gp(i,j,k);
                            tf(i,j,k)  /= rho(i,j,k);
                        });
                    }
                    else
                    {
                        amrex::ParallelFor(gbx, [tf, visc, gp]
                        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                        {
                            tf(i,j,k)  += visc(i,j,k) - gp(i,j,k);
                        });
                    }

                }
                else  // Scalars. Reconstruct forcing terms as in scalar_advection
                {
                    auto const& visc = visc_terms[Smfi].const_array(comp);
                    auto const& rho = rhoMF[Smfi].const_array();

                    if ( NavierStokesBase::do_temp && comp==NavierStokesBase::Temp )
                    {
                        //
                        // Solving
                        //   dT/dt + U dot del T = ( del dot lambda grad T + H_T ) / (rho c_p)
                        // with tforces = H_T/c_p (since it's always density-weighted), and
                        // visc = del dot mu grad T, where mu = lambda/c_p
                        //
                        amrex::ParallelFor(gbx, [tf, visc, rho]
                        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                        { tf(i,j,k) = ( tf(i,j,k) + visc(i,j,k) ) / rho(i,j,k); });
                    }
                    else
                    {
                        if (advectionType[comp] == Conservative)
                        {
                            //
                            // For tracers, Solving
                            //   dS/dt + del dot (U S) = del dot beta grad (S/rho) + rho H_q
                            // where S = rho q, q is a concentration
                            // tforces = rho H_q (since it's always density-weighted)
                            // visc = del dot beta grad (S/rho)
                            //
                            amrex::ParallelFor(gbx, [tf, visc]
                            AMREX_GPU_DEVICE (int i, int j, int k ) noexcept
                            { tf(i,j,k) += visc(i,j,k); });
                        }
                        else
                        {
                            //
                            // Solving
                            //   dS/dt + U dot del S = del dot beta grad S + H_q
                            // where S = q, q is a concentration
                            // tforces = rho H_q (since it's always density-weighted)
                            // visc = del dot beta grad S
                            //
                            amrex::ParallelFor(gbx, [tf, visc, rho]
                            AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                            { tf(i,j,k) = tf(i,j,k) / rho(i,j,k) + visc(i,j,k); });
                        }
                    }
                }
            }
        }

        //
        // Perform sync
        //
        for (int comp = 0; comp < num_state_comps; ++comp)
        {
            // Select sync MF and its component for processing
            const int  sync_comp   = comp < AMREX_SPACEDIM ? comp   : comp-AMREX_SPACEDIM;
            MultiFab*  sync_ptr    = comp < AMREX_SPACEDIM ? &Vsync : &Ssync;
            const bool is_velocity = comp < AMREX_SPACEDIM ? true   : false;
            BCRec  const* d_bcrec_ptr = comp < AMREX_SPACEDIM
                                               ? &(ns_level.get_bcrec_velocity_d_ptr())[sync_comp]
                                               : &(ns_level.get_bcrec_scalars_d_ptr())[sync_comp];

            const auto& Q = (do_mom_diff == 1 and comp < AMREX_SPACEDIM) ? momenta : Smf;

            amrex::Gpu::DeviceVector<int> iconserv;
            Vector<int> iconserv_h;
            iconserv.resize(ncomp);
            iconserv_h.resize(ncomp, 0);
            for (int icomp = 0; icomp < ncomp; icomp++) {
                iconserv_h[icomp] = (advectionType[comp+icomp] == Conservative) ? 1 : 0;
            }
            Gpu::copy(Gpu::hostToDevice, iconserv_h.begin(), iconserv_h.end(), iconserv.begin());
            bool godunov_use_ppm = ( ns_level.advection_scheme == "Godunov_PPM" ? true : false );

#ifdef AMREX_USE_EB
            if ( !(ns_level.EBFactory().isAllRegular()) )
            {
                // Get BCs for this component
                Vector<BCRec>  math_bcs(ncomp);
                math_bcs = ns_level.fetchBCArray(State_Type, comp, ncomp);

                EBGodunov::ComputeSyncAofs(*sync_ptr, sync_comp, ncomp,
                                           Q, comp,
                                           AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                           AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                           AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                                           AMREX_D_DECL(fluxes[0],fluxes[1],fluxes[2]), comp,
                                           forcing_term, comp, *divu_fp,
                                           math_bcs, d_bcrec_ptr,
                                           geom, iconserv, dt, is_velocity,
                                           ns_level.redistribution_type);
            }
            else
#endif
            if (ns_level.advection_scheme == "BDS" && (!is_velocity))
            {
                BDS::ComputeSyncAofs(*sync_ptr, sync_comp, ncomp,
                                     Q, comp,
                                     AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                     AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                     AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                                     AMREX_D_DECL(fluxes[0],fluxes[1],fluxes[2]), comp,
                                     forcing_term, comp, *divu_fp,
                                     d_bcrec_ptr, geom, iconserv, dt, is_velocity);
            }
            else
            {
                Godunov::ComputeSyncAofs(*sync_ptr, sync_comp, ncomp,
                                         Q, comp,
                                         AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                         AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                         AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                                         AMREX_D_DECL(fluxes[0],fluxes[1],fluxes[2]), comp,
                                         forcing_term, comp, *divu_fp,
                                         d_bcrec_ptr, geom, iconserv, dt,
                                         godunov_use_ppm, ns_level.GodunovUseForcesInTrans(),
                                         is_velocity );
            }
        }
    }
    else
    {
        Abort("MacProj::mac_sync_compute: Unkown adveciton scheme");
    }


    if (level > 0 && update_fluxreg)
    {
        const Real mlt =  -1.0/Real(parent->nCycle(level));
        for (int d = 0; d < AMREX_SPACEDIM; ++d)
        {
            for (int comp = 0; comp < num_state_comps; ++comp)
            {
                    adv_flux_reg->FineAdd(fluxes[d],d,comp,comp,1,-dt);
            }
            //
            // Include grad_phi(aka Ucorr) in the mac registers corresponding
            // to the next coarsest interface.
            //
            mac_reg[level]->FineAdd(*Ucorr[d],area[d],d,0,0,1,mlt);
        }
    }
}